

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WindowCodeStep(Parse *pParse,Select *p,WhereInfo *pWInfo,int regGosub,int addrGosub)

{
  Window **ppWVar1;
  short sVar2;
  int p1;
  Window *pWVar3;
  FuncDef *pFVar4;
  char *pcVar5;
  u8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ExprList *pList;
  Vdbe *pVVar11;
  KeyInfo *p4;
  int iVar12;
  Op *pOVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  ExprList *pEVar17;
  int p1_00;
  Window *pWVar18;
  int p2;
  int iVar19;
  int iVar20;
  int iVar21;
  int local_e4;
  long local_e0;
  int local_d0;
  int local_cc;
  long local_b0;
  WindowCodeArg local_a0;
  Vdbe *local_58;
  ExprList *local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  WhereInfo *local_38;
  
  pWVar3 = p->pWin;
  local_50 = pWVar3->pOrderBy;
  local_38 = pWInfo;
  pVVar11 = sqlite3GetVdbe(pParse);
  iVar10 = p->pSrc->a[0].iCursor;
  sVar2 = (p->pSrc->a[0].pTab)->nCol;
  iVar16 = (int)sVar2;
  iVar7 = pParse->nLabel + -1;
  pParse->nLabel = iVar7;
  local_a0.regArg = 0;
  local_a0.eDelete = 0;
  local_a0.end.reg = 0;
  local_a0._68_4_ = 0;
  p1 = pWVar3->iEphCsr;
  local_a0.start.reg = 0;
  iVar20 = p1 + 2;
  local_a0.regRowid = 0;
  iVar8 = p1 + 3;
  local_a0.current.reg = 0;
  local_a0.pParse = pParse;
  local_a0.pMWin = pWVar3;
  local_a0.pVdbe = pVVar11;
  local_a0.addrGosub = addrGosub;
  local_a0.regGosub = regGosub;
  local_a0.start.csr = iVar20;
  local_a0.current.csr = p1;
  local_a0.end.csr = iVar8;
  if (pWVar3->eStart == 'Z') {
    pWVar18 = pWVar3;
    if (pWVar3->regStartRowid == 0) {
      do {
        pcVar5 = pWVar18->pWFunc->zName;
        if ((((pcVar5 == "lag") || (pcVar5 == "lead")) || (pcVar5 == "nth_value")) ||
           (pcVar5 == "first_value")) goto LAB_0017f98b;
        ppWVar1 = &pWVar18->pNextWin;
        pWVar18 = *ppWVar1;
      } while (*ppWVar1 != (Window *)0x0);
      iVar19 = 1;
      if (pWVar3->eEnd != 'X') goto LAB_0017f987;
      if (pWVar3->eFrmType != 'Y') {
        iVar9 = windowExprGtZero((Parse *)pParse->db,pWVar3->pEnd);
        iVar19 = 3;
        goto LAB_0017f908;
      }
    }
  }
  else {
    iVar19 = 2;
    if (pWVar3->eStart == 'V') {
      if (pWVar3->eFrmType != 'Y') {
        iVar9 = windowExprGtZero((Parse *)pParse->db,pWVar3->pStart);
        iVar19 = 1;
LAB_0017f908:
        if (iVar9 != 0) goto LAB_0017f987;
      }
    }
    else {
LAB_0017f987:
      local_a0.eDelete = iVar19;
    }
  }
LAB_0017f98b:
  iVar19 = pParse->nMem;
  iVar9 = iVar19 + iVar16 + 2;
  pParse->nMem = iVar9;
  local_a0.regRowid = iVar9;
  if ((pWVar3->eStart == 'X') || (local_d0 = 0, iVar12 = iVar9, pWVar3->eStart == 'V')) {
    iVar12 = iVar19 + iVar16 + 3;
    pParse->nMem = iVar12;
    local_d0 = iVar12;
  }
  if ((pWVar3->eEnd == 'X') || (pWVar3->eEnd == 'V')) {
    iVar12 = iVar12 + 1;
    pParse->nMem = iVar12;
    local_e4 = iVar12;
  }
  else {
    local_e4 = 0;
  }
  iVar21 = iVar19 + 1;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  p2 = 0;
  p1_00 = 0;
  if (pWVar3->eFrmType != 'L') {
    if (local_50 == (ExprList *)0x0) {
      iVar14 = 0;
    }
    else {
      iVar14 = local_50->nExpr;
    }
    p1_00 = pWVar3->nBufferCol + iVar21;
    if (pWVar3->pPartition != (ExprList *)0x0) {
      p1_00 = p1_00 + pWVar3->pPartition->nExpr;
    }
    p2 = iVar12 + 1;
    local_48 = iVar14 + iVar12 + 1;
    local_44 = iVar14 + iVar14 + iVar12 + 1;
    iVar12 = iVar14 + iVar12 + iVar14;
    local_40 = iVar14 + iVar12 + 1;
    local_a0.end.reg = local_40;
    pParse->nMem = iVar14 * 2 + iVar12;
    local_a0.start.reg = local_48;
    local_a0.current.reg = local_44;
  }
  iVar19 = iVar19 + iVar16 + 1;
  local_3c = iVar20;
  if (0 < sVar2) {
    iVar20 = 0;
    do {
      sqlite3VdbeAddOp3(pVVar11,0x5e,iVar10,iVar20,iVar21 + iVar20);
      iVar20 = iVar20 + 1;
    } while (iVar16 != iVar20);
  }
  iVar10 = p1 + 1;
  local_58 = (Vdbe *)CONCAT44(local_58._4_4_,iVar19);
  sqlite3VdbeAddOp3(pVVar11,0x61,iVar21,iVar16,iVar19);
  pEVar17 = pWVar3->pPartition;
  iVar16 = 0;
  if (pEVar17 == (ExprList *)0x0) {
    local_cc = 0;
    local_b0 = 0;
  }
  else {
    iVar20 = pEVar17->nExpr;
    iVar21 = iVar21 + pWVar3->nBufferCol;
    p4 = sqlite3KeyInfoFromExprList(pParse,pEVar17,0,0);
    local_cc = pParse->nMem + 1;
    pParse->nMem = local_cc;
    iVar19 = sqlite3VdbeAddOp3(pVVar11,0x5a,iVar21,pWVar3->regPart,iVar20);
    if (pVVar11->db->mallocFailed == '\0') {
      pOVar13 = pVVar11->aOp;
      iVar12 = pVVar11->nOp;
      pOVar13[(long)iVar12 + -1].p4type = -8;
      pOVar13[(long)iVar12 + -1].p4.pKeyInfo = p4;
    }
    else {
      freeP4(pVVar11->db,-8,p4);
    }
    sqlite3VdbeAddOp3(pVVar11,0xe,iVar19 + 2,iVar19 + 4,iVar19 + 2);
    iVar19 = sqlite3VdbeAddOp3(pVVar11,10,local_cc,0,0);
    sqlite3VdbeAddOp3(pVVar11,0x50,iVar21,pWVar3->regPart,iVar20 + -1);
    local_b0 = (long)iVar19;
  }
  sqlite3VdbeAddOp3(pVVar11,0x7f,iVar10,iVar9,0);
  sqlite3VdbeAddOp3(pVVar11,0x80,iVar10,(int)local_58,iVar9);
  local_58 = pVVar11;
  iVar20 = sqlite3VdbeAddOp3(pVVar11,0x34,pWVar3->regOne,0,iVar9);
  pVVar11 = sqlite3GetVdbe(pParse);
  pWVar18 = pWVar3;
  do {
    pFVar4 = pWVar18->pWFunc;
    iVar19 = 0;
    sqlite3VdbeAddOp3(pVVar11,0x4b,0,pWVar18->regAccum,0);
    pEVar17 = (pWVar18->pOwner->x).pList;
    if (pEVar17 != (ExprList *)0x0) {
      iVar19 = pEVar17->nExpr;
    }
    if (iVar19 < iVar16) {
      iVar19 = iVar16;
    }
    iVar16 = iVar19;
    if (pWVar3->regStartRowid == 0) {
      pcVar5 = pFVar4->zName;
      if (pcVar5 == "nth_value" || pcVar5 == "first_value") {
        sqlite3VdbeAddOp3(pVVar11,0x47,0,pWVar18->regApp,0);
        sqlite3VdbeAddOp3(pVVar11,0x47,0,pWVar18->regApp + 1,0);
      }
      if (((pFVar4->funcFlags & 0x1000) != 0) && (pWVar18->csrApp != 0)) {
        sqlite3VdbeAddOp3(pVVar11,0x92,pWVar18->csrApp,0,0);
        sqlite3VdbeAddOp3(pVVar11,0x47,0,pWVar18->regApp + 1,0);
      }
    }
    pWVar18 = pWVar18->pNextWin;
  } while (pWVar18 != (Window *)0x0);
  iVar19 = pParse->nMem;
  pParse->nMem = iVar16 + iVar19;
  local_a0.regArg = iVar19 + 1;
  if (local_d0 != 0) {
    sqlite3ExprCode(pParse,pWVar3->pStart,local_d0);
    windowCheckValue(pParse,local_d0,(uint)(pWVar3->eFrmType == 'Y') * 3);
  }
  pEVar17 = local_50;
  pVVar11 = local_58;
  if (local_e4 != 0) {
    sqlite3ExprCode(pParse,pWVar3->pEnd,local_e4);
    windowCheckValue(pParse,local_e4,(uint)(pWVar3->eFrmType == 'Y') * 3 + 1);
  }
  if (pWVar3->eFrmType == 'Y') {
LAB_0017feb6:
    uVar6 = pWVar3->eStart;
  }
  else {
    uVar6 = pWVar3->eStart;
    if ((local_d0 != 0) && (uVar6 == pWVar3->eEnd)) {
      iVar16 = sqlite3VdbeAddOp3(pVVar11,(uint)(uVar6 == 'V') * 2 + 0x37,local_d0,0,local_e4);
      windowAggFinal((WindowCodeArg *)pParse,(int)pWVar3);
      sqlite3VdbeAddOp3(pVVar11,0x24,p1,0,0);
      windowReturnOneRow(&local_a0);
      sqlite3VdbeAddOp3(pVVar11,0x92,p1,0,0);
      sqlite3VdbeAddOp3(pVVar11,9,0,iVar7,0);
      if (pVVar11->db->mallocFailed == '\0') {
        pOVar13 = pVVar11->aOp + iVar16;
      }
      else {
        pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar13->p2 = pVVar11->nOp;
      pEVar17 = local_50;
      goto LAB_0017feb6;
    }
  }
  if (uVar6 == 'V') {
    if ((local_e4 != 0) && (pWVar3->eFrmType != 'Y')) {
      sqlite3VdbeAddOp3(pVVar11,0x6b,local_d0,local_e4,local_d0);
      uVar6 = pWVar3->eStart;
      goto LAB_0017fee7;
    }
LAB_0017feeb:
    sqlite3VdbeAddOp3(pVVar11,0x24,local_3c,0,0);
  }
  else {
LAB_0017fee7:
    if (uVar6 != 'Z') goto LAB_0017feeb;
  }
  sqlite3VdbeAddOp3(pVVar11,0x24,p1,0,0);
  sqlite3VdbeAddOp3(pVVar11,0x24,iVar8,0,0);
  if (pEVar17 != (ExprList *)0x0 && p2 != 0) {
    sqlite3VdbeAddOp3(pVVar11,0x50,p1_00,p2,pEVar17->nExpr + -1);
    sqlite3VdbeAddOp3(pVVar11,0x50,p2,local_48,pEVar17->nExpr + -1);
    sqlite3VdbeAddOp3(pVVar11,0x50,p2,local_44,pEVar17->nExpr + -1);
    sqlite3VdbeAddOp3(pVVar11,0x50,p2,local_40,pEVar17->nExpr + -1);
  }
  sqlite3VdbeAddOp3(pVVar11,9,0,iVar7,0);
  if (pVVar11->db->mallocFailed == '\0') {
    pOVar13 = pVVar11->aOp + iVar20;
  }
  else {
    pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar13->p2 = pVVar11->nOp;
  if (p2 != 0) {
    windowIfNewPeer(pParse,pEVar17,p1_00,p2,iVar7);
  }
  if (pWVar3->eStart == 'V') {
    windowCodeOp(&local_a0,3,0,0);
    if (pWVar3->eEnd != 'Z') {
      iVar16 = local_e4;
      if (pWVar3->eFrmType != 'Y') {
LAB_001801c6:
        windowCodeOp(&local_a0,1,iVar16,0);
        iVar16 = 2;
        iVar8 = local_d0;
        goto LAB_001801d8;
      }
      iVar20 = pParse->nLabel + -1;
      pParse->nLabel = iVar20;
      iVar16 = pVVar11->nOp;
      windowCodeRangeTest(&local_a0,0x39,p1,local_e4,iVar8,iVar20);
      windowCodeOp(&local_a0,2,local_d0,0);
      windowCodeOp(&local_a0,1,0,0);
LAB_0018023f:
      sqlite3VdbeAddOp3(pVVar11,9,0,iVar16,0);
      sqlite3VdbeResolveLabel(pVVar11,iVar20);
    }
  }
  else {
    if (pWVar3->eEnd != 'X') {
      windowCodeOp(&local_a0,3,0,0);
      if (pWVar3->eEnd != 'Z') {
        if (pWVar3->eFrmType == 'Y') {
          iVar16 = pVVar11->nOp;
          if (local_e4 == 0) {
            iVar20 = 0;
          }
          else {
            iVar20 = pParse->nLabel + -1;
            pParse->nLabel = iVar20;
            windowCodeRangeTest(&local_a0,0x39,p1,local_e4,iVar8,iVar20);
          }
          windowCodeOp(&local_a0,1,0,0);
          windowCodeOp(&local_a0,2,local_d0,0);
          if (local_e4 != 0) goto LAB_0018023f;
        }
        else {
          if (local_e4 == 0) {
            lVar15 = 0;
          }
          else {
            iVar8 = sqlite3VdbeAddOp3(pVVar11,0x3b,local_e4,0,1);
            lVar15 = (long)iVar8;
          }
          windowCodeOp(&local_a0,1,0,0);
          windowCodeOp(&local_a0,2,local_d0,0);
          if (local_e4 != 0) {
            if (pVVar11->db->mallocFailed == '\0') {
              pOVar13 = pVVar11->aOp + lVar15;
            }
            else {
              pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
            }
            pOVar13->p2 = pVVar11->nOp;
          }
        }
      }
      goto LAB_0018025e;
    }
    if (pWVar3->eStart != 'X') {
      windowCodeOp(&local_a0,3,local_e4,0);
LAB_001801b7:
      iVar16 = 0;
      goto LAB_001801c6;
    }
    uVar6 = pWVar3->eFrmType;
    windowCodeOp(&local_a0,3,local_e4,0);
    if (uVar6 != 'Y') goto LAB_001801b7;
    windowCodeOp(&local_a0,2,local_d0,0);
    iVar16 = 1;
    iVar8 = 0;
LAB_001801d8:
    windowCodeOp(&local_a0,iVar16,iVar8,0);
  }
LAB_0018025e:
  sqlite3VdbeResolveLabel(pVVar11,iVar7);
  sqlite3WhereEnd(local_38);
  if (pWVar3->pPartition == (ExprList *)0x0) {
    local_e0 = 0;
  }
  else {
    iVar7 = sqlite3VdbeAddOp3(pVVar11,0x47,0,local_cc,0);
    if (pVVar11->db->mallocFailed == '\0') {
      pOVar13 = pVVar11->aOp + local_b0;
    }
    else {
      pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar13->p2 = pVVar11->nOp;
    local_e0 = (long)iVar7;
  }
  local_a0._40_8_ = local_a0._40_8_ & 0xffffffff00000000;
  iVar10 = sqlite3VdbeAddOp3(pVVar11,0x24,iVar10,0,0);
  uVar6 = pWVar3->eStart;
  if (pWVar3->eEnd != 'X') {
    windowCodeOp(&local_a0,3,0,0);
    if (uVar6 == 'V') {
      if (pWVar3->eFrmType == 'Y') {
        iVar7 = pVVar11->nOp;
        iVar16 = windowCodeOp(&local_a0,2,local_d0,1);
        iVar8 = windowCodeOp(&local_a0,1,0,1);
      }
      else {
        iVar7 = pVVar11->nOp;
        if (pWVar3->eEnd == 'Z') {
          iVar8 = windowCodeOp(&local_a0,1,local_d0,1);
          local_d0 = 0;
        }
        else {
          iVar8 = windowCodeOp(&local_a0,1,local_e4,1);
        }
        iVar16 = windowCodeOp(&local_a0,2,local_d0,1);
      }
      sqlite3VdbeAddOp3(pVVar11,9,0,iVar7,0);
      iVar7 = pVVar11->nOp;
      if (pVVar11->db->mallocFailed == '\0') {
        pOVar13 = pVVar11->aOp + iVar16;
      }
      else {
        pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar13->p2 = iVar7;
      iVar16 = windowCodeOp(&local_a0,1,0,1);
      sqlite3VdbeAddOp3(pVVar11,9,0,iVar7,0);
      iVar7 = pVVar11->nOp;
      uVar6 = pVVar11->db->mallocFailed;
      if (uVar6 == '\0') {
        pOVar13 = pVVar11->aOp;
        pOVar13[iVar8].p2 = iVar7;
        pOVar13 = pOVar13 + iVar16;
      }
      else {
        pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
        DAT_001e99e8 = iVar7;
      }
      pOVar13->p2 = iVar7;
    }
    else {
      iVar7 = pVVar11->nOp;
      iVar8 = windowCodeOp(&local_a0,1,0,1);
      windowCodeOp(&local_a0,2,local_d0,0);
      sqlite3VdbeAddOp3(pVVar11,9,0,iVar7,0);
      iVar7 = pVVar11->nOp;
      uVar6 = pVVar11->db->mallocFailed;
      if (uVar6 == '\0') {
        pOVar13 = pVVar11->aOp + iVar8;
      }
      else {
        pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar13->p2 = iVar7;
    }
    goto LAB_00180587;
  }
  if (uVar6 == 'X') {
    uVar6 = pWVar3->eFrmType;
    windowCodeOp(&local_a0,3,local_e4,0);
    if (uVar6 == 'Y') {
      iVar7 = 2;
      goto LAB_001803bd;
    }
  }
  else {
    iVar7 = 3;
    local_d0 = local_e4;
LAB_001803bd:
    windowCodeOp(&local_a0,iVar7,local_d0,0);
  }
  windowCodeOp(&local_a0,1,0,0);
  iVar7 = pVVar11->nOp;
  uVar6 = pVVar11->db->mallocFailed;
LAB_00180587:
  if (uVar6 == '\0') {
    pOVar13 = pVVar11->aOp + iVar10;
  }
  else {
    pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar13->p2 = iVar7;
  sqlite3VdbeAddOp3(pVVar11,0x92,p1,0,0);
  if (pWVar3->pPartition == (ExprList *)0x0) {
    return;
  }
  if (pWVar3->regStartRowid != 0) {
    sqlite3VdbeAddOp3(pVVar11,0x47,1,pWVar3->regStartRowid,0);
    sqlite3VdbeAddOp3(pVVar11,0x47,0,pWVar3->regEndRowid,0);
  }
  if (pVVar11->db->mallocFailed == '\0') {
    pOVar13 = pVVar11->aOp + local_e0;
  }
  else {
    pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar13->p1 = pVVar11->nOp;
  sqlite3VdbeAddOp3(pVVar11,0x43,local_cc,0,0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowCodeStep(
  Parse *pParse,                  /* Parse context */
  Select *p,                      /* Rewritten SELECT statement */
  WhereInfo *pWInfo,              /* Context returned by sqlite3WhereBegin() */
  int regGosub,                   /* Register for OP_Gosub */
  int addrGosub                   /* OP_Gosub here to return each row */
){
  Window *pMWin = p->pWin;
  ExprList *pOrderBy = pMWin->pOrderBy;
  Vdbe *v = sqlite3GetVdbe(pParse);
  int csrWrite;                   /* Cursor used to write to eph. table */
  int csrInput = p->pSrc->a[0].iCursor;     /* Cursor of sub-select */
  int nInput = p->pSrc->a[0].pTab->nCol;    /* Number of cols returned by sub */
  int iInput;                               /* To iterate through sub cols */
  int addrNe;                     /* Address of OP_Ne */
  int addrGosubFlush = 0;         /* Address of OP_Gosub to flush: */
  int addrInteger = 0;            /* Address of OP_Integer */
  int addrEmpty;                  /* Address of OP_Rewind in flush: */
  int regNew;                     /* Array of registers holding new input row */
  int regRecord;                  /* regNew array in record form */
  int regNewPeer = 0;             /* Peer values for new row (part of regNew) */
  int regPeer = 0;                /* Peer values for current row */
  int regFlushPart = 0;           /* Register for "Gosub flush_partition" */
  WindowCodeArg s;                /* Context object for sub-routines */
  int lblWhereEnd;                /* Label just before sqlite3WhereEnd() code */
  int regStart = 0;               /* Value of <expr> PRECEDING */
  int regEnd = 0;                 /* Value of <expr> FOLLOWING */

  assert( pMWin->eStart==TK_PRECEDING || pMWin->eStart==TK_CURRENT
       || pMWin->eStart==TK_FOLLOWING || pMWin->eStart==TK_UNBOUNDED
  );
  assert( pMWin->eEnd==TK_FOLLOWING || pMWin->eEnd==TK_CURRENT
       || pMWin->eEnd==TK_UNBOUNDED || pMWin->eEnd==TK_PRECEDING
  );
  assert( pMWin->eExclude==0 || pMWin->eExclude==TK_CURRENT
       || pMWin->eExclude==TK_GROUP || pMWin->eExclude==TK_TIES
       || pMWin->eExclude==TK_NO
  );

  lblWhereEnd = sqlite3VdbeMakeLabel(pParse);

  /* Fill in the context object */
  memset(&s, 0, sizeof(WindowCodeArg));
  s.pParse = pParse;
  s.pMWin = pMWin;
  s.pVdbe = v;
  s.regGosub = regGosub;
  s.addrGosub = addrGosub;
  s.current.csr = pMWin->iEphCsr;
  csrWrite = s.current.csr+1;
  s.start.csr = s.current.csr+2;
  s.end.csr = s.current.csr+3;

  /* Figure out when rows may be deleted from the ephemeral table. There
  ** are four options - they may never be deleted (eDelete==0), they may
  ** be deleted as soon as they are no longer part of the window frame
  ** (eDelete==WINDOW_AGGINVERSE), they may be deleted as after the row
  ** has been returned to the caller (WINDOW_RETURN_ROW), or they may
  ** be deleted after they enter the frame (WINDOW_AGGSTEP). */
  switch( pMWin->eStart ){
    case TK_FOLLOWING:
      if( pMWin->eFrmType!=TK_RANGE
       && windowExprGtZero(pParse, pMWin->pStart)
      ){
        s.eDelete = WINDOW_RETURN_ROW;
      }
      break;
    case TK_UNBOUNDED:
      if( windowCacheFrame(pMWin)==0 ){
        if( pMWin->eEnd==TK_PRECEDING ){
          if( pMWin->eFrmType!=TK_RANGE
           && windowExprGtZero(pParse, pMWin->pEnd)
          ){
            s.eDelete = WINDOW_AGGSTEP;
          }
        }else{
          s.eDelete = WINDOW_RETURN_ROW;
        }
      }
      break;
    default:
      s.eDelete = WINDOW_AGGINVERSE;
      break;
  }

  /* Allocate registers for the array of values from the sub-query, the
  ** same values in record form, and the rowid used to insert said record
  ** into the ephemeral table.  */
  regNew = pParse->nMem+1;
  pParse->nMem += nInput;
  regRecord = ++pParse->nMem;
  s.regRowid = ++pParse->nMem;

  /* If the window frame contains an "<expr> PRECEDING" or "<expr> FOLLOWING"
  ** clause, allocate registers to store the results of evaluating each
  ** <expr>.  */
  if( pMWin->eStart==TK_PRECEDING || pMWin->eStart==TK_FOLLOWING ){
    regStart = ++pParse->nMem;
  }
  if( pMWin->eEnd==TK_PRECEDING || pMWin->eEnd==TK_FOLLOWING ){
    regEnd = ++pParse->nMem;
  }

  /* If this is not a "ROWS BETWEEN ..." frame, then allocate arrays of
  ** registers to store copies of the ORDER BY expressions (peer values)
  ** for the main loop, and for each cursor (start, current and end). */
  if( pMWin->eFrmType!=TK_ROWS ){
    int nPeer = (pOrderBy ? pOrderBy->nExpr : 0);
    regNewPeer = regNew + pMWin->nBufferCol;
    if( pMWin->pPartition ) regNewPeer += pMWin->pPartition->nExpr;
    regPeer = pParse->nMem+1;       pParse->nMem += nPeer;
    s.start.reg = pParse->nMem+1;   pParse->nMem += nPeer;
    s.current.reg = pParse->nMem+1; pParse->nMem += nPeer;
    s.end.reg = pParse->nMem+1;     pParse->nMem += nPeer;
  }

  /* Load the column values for the row returned by the sub-select
  ** into an array of registers starting at regNew. Assemble them into
  ** a record in register regRecord. */
  for(iInput=0; iInput<nInput; iInput++){
    sqlite3VdbeAddOp3(v, OP_Column, csrInput, iInput, regNew+iInput);
  }
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regNew, nInput, regRecord);

  /* An input row has just been read into an array of registers starting
  ** at regNew. If the window has a PARTITION clause, this block generates
  ** VM code to check if the input row is the start of a new partition.
  ** If so, it does an OP_Gosub to an address to be filled in later. The
  ** address of the OP_Gosub is stored in local variable addrGosubFlush. */
  if( pMWin->pPartition ){
    int addr;
    ExprList *pPart = pMWin->pPartition;
    int nPart = pPart->nExpr;
    int regNewPart = regNew + pMWin->nBufferCol;
    KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pPart, 0, 0);

    regFlushPart = ++pParse->nMem;
    addr = sqlite3VdbeAddOp3(v, OP_Compare, regNewPart, pMWin->regPart, nPart);
    sqlite3VdbeAppendP4(v, (void*)pKeyInfo, P4_KEYINFO);
    sqlite3VdbeAddOp3(v, OP_Jump, addr+2, addr+4, addr+2);
    VdbeCoverageEqNe(v);
    addrGosubFlush = sqlite3VdbeAddOp1(v, OP_Gosub, regFlushPart);
    VdbeComment((v, "call flush_partition"));
    sqlite3VdbeAddOp3(v, OP_Copy, regNewPart, pMWin->regPart, nPart-1);
  }

  /* Insert the new row into the ephemeral table */
  sqlite3VdbeAddOp2(v, OP_NewRowid, csrWrite, s.regRowid);
  sqlite3VdbeAddOp3(v, OP_Insert, csrWrite, regRecord, s.regRowid);
  addrNe = sqlite3VdbeAddOp3(v, OP_Ne, pMWin->regOne, 0, s.regRowid);
  VdbeCoverageNeverNull(v);

  /* This block is run for the first row of each partition */
  s.regArg = windowInitAccum(pParse, pMWin);

  if( regStart ){
    sqlite3ExprCode(pParse, pMWin->pStart, regStart);
    windowCheckValue(pParse, regStart, 0 + (pMWin->eFrmType==TK_RANGE?3:0));
  }
  if( regEnd ){
    sqlite3ExprCode(pParse, pMWin->pEnd, regEnd);
    windowCheckValue(pParse, regEnd, 1 + (pMWin->eFrmType==TK_RANGE?3:0));
  }

  if( pMWin->eFrmType!=TK_RANGE && pMWin->eStart==pMWin->eEnd && regStart ){
    int op = ((pMWin->eStart==TK_FOLLOWING) ? OP_Ge : OP_Le);
    int addrGe = sqlite3VdbeAddOp3(v, op, regStart, 0, regEnd);
    VdbeCoverageNeverNullIf(v, op==OP_Ge); /* NeverNull because bound <expr> */
    VdbeCoverageNeverNullIf(v, op==OP_Le); /*   values previously checked */
    windowAggFinal(&s, 0);
    sqlite3VdbeAddOp1(v, OP_Rewind, s.current.csr);
    windowReturnOneRow(&s);
    sqlite3VdbeAddOp1(v, OP_ResetSorter, s.current.csr);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, lblWhereEnd);
    sqlite3VdbeJumpHere(v, addrGe);
  }
  if( pMWin->eStart==TK_FOLLOWING && pMWin->eFrmType!=TK_RANGE && regEnd ){
    assert( pMWin->eEnd==TK_FOLLOWING );
    sqlite3VdbeAddOp3(v, OP_Subtract, regStart, regEnd, regStart);
  }

  if( pMWin->eStart!=TK_UNBOUNDED ){
    sqlite3VdbeAddOp1(v, OP_Rewind, s.start.csr);
  }
  sqlite3VdbeAddOp1(v, OP_Rewind, s.current.csr);
  sqlite3VdbeAddOp1(v, OP_Rewind, s.end.csr);
  if( regPeer && pOrderBy ){
    sqlite3VdbeAddOp3(v, OP_Copy, regNewPeer, regPeer, pOrderBy->nExpr-1);
    sqlite3VdbeAddOp3(v, OP_Copy, regPeer, s.start.reg, pOrderBy->nExpr-1);
    sqlite3VdbeAddOp3(v, OP_Copy, regPeer, s.current.reg, pOrderBy->nExpr-1);
    sqlite3VdbeAddOp3(v, OP_Copy, regPeer, s.end.reg, pOrderBy->nExpr-1);
  }

  sqlite3VdbeAddOp2(v, OP_Goto, 0, lblWhereEnd);

  sqlite3VdbeJumpHere(v, addrNe);

  /* Beginning of the block executed for the second and subsequent rows. */
  if( regPeer ){
    windowIfNewPeer(pParse, pOrderBy, regNewPeer, regPeer, lblWhereEnd);
  }
  if( pMWin->eStart==TK_FOLLOWING ){
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    if( pMWin->eEnd!=TK_UNBOUNDED ){
      if( pMWin->eFrmType==TK_RANGE ){
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int addrNext = sqlite3VdbeCurrentAddr(v);
        windowCodeRangeTest(&s, OP_Ge, s.current.csr, regEnd, s.end.csr, lbl);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
        windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
        sqlite3VdbeAddOp2(v, OP_Goto, 0, addrNext);
        sqlite3VdbeResolveLabel(v, lbl);
      }else{
        windowCodeOp(&s, WINDOW_RETURN_ROW, regEnd, 0);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
      }
    }
  }else
  if( pMWin->eEnd==TK_PRECEDING ){
    int bRPS = (pMWin->eStart==TK_PRECEDING && pMWin->eFrmType==TK_RANGE);
    windowCodeOp(&s, WINDOW_AGGSTEP, regEnd, 0);
    if( bRPS ) windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
    windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
    if( !bRPS ) windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
  }else{
    int addr = 0;
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    if( pMWin->eEnd!=TK_UNBOUNDED ){
      if( pMWin->eFrmType==TK_RANGE ){
        int lbl = 0;
        addr = sqlite3VdbeCurrentAddr(v);
        if( regEnd ){
          lbl = sqlite3VdbeMakeLabel(pParse);
          windowCodeRangeTest(&s, OP_Ge, s.current.csr, regEnd, s.end.csr, lbl);
        }
        windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
        if( regEnd ){
          sqlite3VdbeAddOp2(v, OP_Goto, 0, addr);
          sqlite3VdbeResolveLabel(v, lbl);
        }
      }else{
        if( regEnd ){
          addr = sqlite3VdbeAddOp3(v, OP_IfPos, regEnd, 0, 1);
          VdbeCoverage(v);
        }
        windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
        if( regEnd ) sqlite3VdbeJumpHere(v, addr);
      }
    }
  }

  /* End of the main input loop */
  sqlite3VdbeResolveLabel(v, lblWhereEnd);
  sqlite3WhereEnd(pWInfo);

  /* Fall through */
  if( pMWin->pPartition ){
    addrInteger = sqlite3VdbeAddOp2(v, OP_Integer, 0, regFlushPart);
    sqlite3VdbeJumpHere(v, addrGosubFlush);
  }

  s.regRowid = 0;
  addrEmpty = sqlite3VdbeAddOp1(v, OP_Rewind, csrWrite);
  VdbeCoverage(v);
  if( pMWin->eEnd==TK_PRECEDING ){
    int bRPS = (pMWin->eStart==TK_PRECEDING && pMWin->eFrmType==TK_RANGE);
    windowCodeOp(&s, WINDOW_AGGSTEP, regEnd, 0);
    if( bRPS ) windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
    windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
  }else if( pMWin->eStart==TK_FOLLOWING ){
    int addrStart;
    int addrBreak1;
    int addrBreak2;
    int addrBreak3;
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    if( pMWin->eFrmType==TK_RANGE ){
      addrStart = sqlite3VdbeCurrentAddr(v);
      addrBreak2 = windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 1);
      addrBreak1 = windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 1);
    }else
    if( pMWin->eEnd==TK_UNBOUNDED ){
      addrStart = sqlite3VdbeCurrentAddr(v);
      addrBreak1 = windowCodeOp(&s, WINDOW_RETURN_ROW, regStart, 1);
      addrBreak2 = windowCodeOp(&s, WINDOW_AGGINVERSE, 0, 1);
    }else{
      assert( pMWin->eEnd==TK_FOLLOWING );
      addrStart = sqlite3VdbeCurrentAddr(v);
      addrBreak1 = windowCodeOp(&s, WINDOW_RETURN_ROW, regEnd, 1);
      addrBreak2 = windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 1);
    }
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrStart);
    sqlite3VdbeJumpHere(v, addrBreak2);
    addrStart = sqlite3VdbeCurrentAddr(v);
    addrBreak3 = windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 1);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrStart);
    sqlite3VdbeJumpHere(v, addrBreak1);
    sqlite3VdbeJumpHere(v, addrBreak3);
  }else{
    int addrBreak;
    int addrStart;
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    addrStart = sqlite3VdbeCurrentAddr(v);
    addrBreak = windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 1);
    windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrStart);
    sqlite3VdbeJumpHere(v, addrBreak);
  }
  sqlite3VdbeJumpHere(v, addrEmpty);

  sqlite3VdbeAddOp1(v, OP_ResetSorter, s.current.csr);
  if( pMWin->pPartition ){
    if( pMWin->regStartRowid ){
      sqlite3VdbeAddOp2(v, OP_Integer, 1, pMWin->regStartRowid);
      sqlite3VdbeAddOp2(v, OP_Integer, 0, pMWin->regEndRowid);
    }
    sqlite3VdbeChangeP1(v, addrInteger, sqlite3VdbeCurrentAddr(v));
    sqlite3VdbeAddOp1(v, OP_Return, regFlushPart);
  }
}